

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O0

void __thiscall
deqp::egl::ApiCase::ApiCase(ApiCase *this,EglTestContext *eglTestCtx,char *name,char *description)

{
  Library *egl;
  TestContext *this_00;
  TestLog *log;
  char *description_local;
  char *name_local;
  EglTestContext *eglTestCtx_local;
  ApiCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  egl = EglTestContext::getLibrary(eglTestCtx);
  this_00 = EglTestContext::getTestContext(eglTestCtx);
  log = tcu::TestContext::getLog(this_00);
  eglu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,egl,log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00677b38;
  this->m_display = (EGLDisplay)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_supportedClientAPIs);
  return;
}

Assistant:

ApiCase::ApiCase (EglTestContext& eglTestCtx, const char* name, const char* description)
	: TestCase		(eglTestCtx, name, description)
	, CallLogWrapper(eglTestCtx.getLibrary(), eglTestCtx.getTestContext().getLog())
	, m_display		(EGL_NO_DISPLAY)
{
}